

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

int __thiscall
absl::Cord::CompareSlowPath(Cord *this,string_view rhs,size_t compared_size,size_t size_to_compare)

{
  byte bVar1;
  CordRep *tree;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dd;
  ChunkIterator lhs_it;
  string_view local_f0;
  size_t local_e0;
  string_view local_d8;
  ChunkIterator local_c8;
  
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  local_c8.current_leaf_ = (CordRep *)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  tree = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (CordRep *)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) == 0) {
      local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
      local_c8.current_chunk_._M_str = (char *)((long)&(this->contents_).data_.rep_.field_0 + 1);
      local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
      goto LAB_0017491b;
    }
    CompareSlowPath();
    uVar7 = extraout_XMM0_Da;
    uVar8 = extraout_XMM0_Db;
    uVar9 = extraout_XMM0_Dc;
    uVar10 = extraout_XMM0_Dd;
LAB_00174931:
    local_c8.current_chunk_._M_len._4_4_ = uVar8;
    local_c8.current_chunk_._M_len._0_4_ = uVar7;
    local_c8.current_chunk_._M_str._0_4_ = uVar9;
    local_c8.current_chunk_._M_str._4_4_ = uVar10;
  }
  else {
    local_c8.bytes_remaining_ = tree->length;
    if (local_c8.bytes_remaining_ == 0) goto LAB_00174931;
    ChunkIterator::InitTree(&local_c8,tree);
LAB_0017491b:
    if (local_c8.bytes_remaining_ != 0) {
      local_f0._M_str = local_c8.current_chunk_._M_str;
      sVar4 = local_c8.current_chunk_._M_len;
      goto LAB_0017493a;
    }
  }
  local_f0._M_str = (char *)0x0;
  sVar4 = 0;
LAB_0017493a:
  local_f0._M_len = sVar4 - compared_size;
  if (sVar4 < compared_size) {
    __assert_fail("compared_size <= lhs_chunk.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.cc"
                  ,0x38e,"int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const")
    ;
  }
  uVar6 = rhs._M_len - compared_size;
  if (rhs._M_len < compared_size) {
    __assert_fail("compared_size <= rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.cc"
                  ,0x38f,"int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const")
    ;
  }
  local_f0._M_str = local_f0._M_str + compared_size;
  local_d8._M_str = rhs._M_str + compared_size;
  local_e0 = size_to_compare - compared_size;
  local_d8._M_len = uVar6;
  do {
    iVar2 = 0;
    if (local_f0._M_len == 0) {
      if (local_c8.bytes_remaining_ == 0) {
        CompareSlowPath();
LAB_00174a7a:
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.h"
                      ,0x616,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      uVar5 = local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len;
      if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) goto LAB_00174a7a;
      sVar4 = local_c8.bytes_remaining_;
      local_c8.bytes_remaining_ = uVar5;
      if (uVar5 != 0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_c8.current_chunk_._M_len == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.h"
                          ,0x61c,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
          sVar4 = 0;
        }
        else {
          local_c8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_c8.btree_reader_)
          ;
          sVar4 = local_c8.current_chunk_._M_len;
        }
      }
      if (local_c8.bytes_remaining_ == 0) {
        uVar3 = (uint)(local_d8._M_len == 0);
        iVar2 = -1;
        goto LAB_00174a5d;
      }
      local_f0._M_str = local_c8.current_chunk_._M_str;
      iVar2 = -(uint)(sVar4 == 0);
      local_f0._M_len = sVar4;
    }
    if (local_d8._M_len == 0) {
      uVar3 = 1;
LAB_00174a5d:
      return iVar2 + uVar3;
    }
    uVar3 = anon_unknown_50::CompareChunks(&local_f0,&local_d8,&local_e0);
    uVar6 = uVar6 & 0xffffffff;
    if (local_e0 == 0) {
      uVar6 = 0;
    }
    if (uVar3 != 0) {
      uVar6 = (ulong)uVar3;
    }
    if (uVar3 != 0) {
      return (int)uVar6;
    }
    if (local_e0 == 0) {
      return (int)uVar6;
    }
  } while( true );
}

Assistant:

inline int Cord::CompareSlowPath(absl::string_view rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](Cord::ChunkIterator* absl_nonnull it,
                    absl::string_view* absl_nonnull chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();

  // compared_size is inside first chunk.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && !rhs.empty()) {
    int comparison_result = CompareChunks(&lhs_chunk, &rhs, &size_to_compare);
    if (comparison_result != 0) return comparison_result;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs.empty()) - static_cast<int>(lhs_chunk.empty());
}